

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O1

bool __thiscall
CAPSFile::ReadRecordHeader(CAPSFile *this,uchar *buffer,RecordHeader *header_out,size_t size)

{
  uint uVar1;
  uchar *buffer_00;
  uint size_00;
  bool bVar2;
  ulong __n;
  
  *(undefined4 *)header_out->type = *(undefined4 *)buffer;
  uVar1 = *(uint *)(buffer + 4);
  size_00 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  __n = (ulong)size_00;
  header_out->length = size_00;
  uVar1 = *(uint *)(buffer + 8);
  header_out->crc = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if (size < __n) {
    bVar2 = false;
  }
  else {
    buffer_00 = (uchar *)operator_new__(__n);
    memcpy(buffer_00,buffer,__n);
    buffer_00[8] = '\0';
    buffer_00[9] = '\0';
    buffer_00[10] = '\0';
    buffer_00[0xb] = '\0';
    uVar1 = CRC::ComputeCrc32(0xedb88320,buffer_00,size_00);
    operator_delete__(buffer_00);
    bVar2 = uVar1 == header_out->crc;
  }
  return bVar2;
}

Assistant:

bool CAPSFile::ReadRecordHeader(const unsigned char* buffer, RecordHeader* header_out, size_t size)
{
   memcpy(header_out->type, &buffer[0], 4);
   header_out->length = ExtractInt(&buffer[4]);
   header_out->crc = ExtractInt(&buffer[8]);

   // Copy buffer to check
   if (header_out->length > size) return false;

   unsigned char* buffer_to_check = new unsigned char[header_out->length];
   memcpy(buffer_to_check, buffer, header_out->length);
   // Check the CRC
   memset(&buffer_to_check[8], 0, 4);

   unsigned int crc = CRC::ComputeCrc32(0xEDB88320, buffer_to_check, header_out->length);
   delete[] buffer_to_check;

   return (crc == header_out->crc);
}